

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void nivalis::anon_unknown_1::buf_add_screen_rectangle
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,float x,float y,float w,float h,bool fill,color *c,
               float thickness,size_t rel_func)

{
  int iVar1;
  int iVar2;
  pointer pDVar3;
  pointer paVar4;
  double dVar5;
  double *pdVar6;
  long lVar7;
  undefined7 in_register_00000011;
  color *other;
  bool bVar8;
  double dVar9;
  long lStack_120;
  DrawBufferObject rect;
  undefined1 local_58 [48];
  
  other = (color *)CONCAT71(in_register_00000011,fill);
  if (w <= 0.0) {
    return;
  }
  if (h <= 0.0) {
    return;
  }
  DrawBufferObject::DrawBufferObject(&rect);
  rect.type = FILLED_RECT;
  local_58._8_4_ = (float)SUB84((double)y,0);
  local_58._0_8_ = (double)x;
  local_58._12_4_ = (float)((ulong)(double)y >> 0x20);
  local_58._24_4_ = SUB84((double)(h + y),0);
  local_58._16_8_ = (double)(w + x);
  local_58._28_4_ = (int)((ulong)(double)(h + y) >> 0x20);
  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
  _M_assign_aux<std::array<double,2ul>const*>
            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&rect,local_58
            );
  rect.thickness = 0.0;
  dVar9 = render_view->xmax - render_view->xmin;
  dVar5 = render_view->ymax - render_view->ymin;
  iVar1 = render_view->swid;
  lVar7 = (long)rect.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)rect.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  iVar2 = render_view->shigh;
  pdVar6 = (rect.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start)->_M_elems + 1;
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    ((array<double,_2UL> *)(pdVar6 + -1))->_M_elems[0] =
         (((array<double,_2UL> *)(pdVar6 + -1))->_M_elems[0] / (double)iVar1) * dVar9 +
         render_view->xmin;
    *pdVar6 = (((double)iVar2 - *pdVar6) / (double)iVar2) * dVar5 + render_view->ymin;
    pdVar6 = pdVar6 + 2;
  }
  pDVar3 = (draw_buf->
           super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  rect.rel_func = (size_t)c;
  if ((pDVar3 == (draw_buf->
                 super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                 )._M_impl.super__Vector_impl_data._M_start) || (pDVar3[-1].type != FILLED_RECT)) {
LAB_001398b9:
    color::color::operator=((color *)local_58,&rect.c,other);
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
    emplace_back<nivalis::DrawBufferObject>(draw_buf,&rect);
  }
  else {
    paVar4 = pDVar3[-1].points.
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar5 = dVar5 * 1e-06;
    if ((dVar5 <= ABS(paVar4->_M_elems[1] -
                      (rect.points.
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1])) ||
       ((dVar5 <= ABS(paVar4[1]._M_elems[1] -
                      rect.points.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[1]) ||
        (dVar9 * 1e-06 <=
         ABS(paVar4[1]._M_elems[0] -
             (rect.points.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]))))) {
LAB_00139837:
      paVar4 = pDVar3[-1].points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((dVar9 * 1e-06 <=
             ABS(paVar4->_M_elems[0] -
                 (rect.points.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0])) ||
           (dVar9 * 1e-06 <=
            ABS(paVar4[1]._M_elems[0] -
                rect.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[0]))) ||
          (dVar5 <= ABS(paVar4[1]._M_elems[1] -
                        (rect.points.
                         super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1]))) ||
         (bVar8 = color::color::operator==(&pDVar3[-1].c,other), !bVar8)) goto LAB_001398b9;
      pdVar6 = rect.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_elems + 1;
      lStack_120 = 0x18;
    }
    else {
      bVar8 = color::color::operator==(&pDVar3[-1].c,other);
      if (!bVar8) {
        if (pDVar3[-1].type != FILLED_RECT) goto LAB_001398b9;
        goto LAB_00139837;
      }
      pdVar6 = rect.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_elems;
      lStack_120 = 0x10;
    }
    *(double *)
     ((long)(pDVar3[-1].points.
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_elems + lStack_120) = *pdVar6;
  }
  DrawBufferObject::~DrawBufferObject(&rect);
  return;
}

Assistant:

void buf_add_screen_rectangle(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        float x, float y, float w, float h, bool fill, const color::color& c,
        float thickness, size_t rel_func) {
    if (w <= 0. || h <= 0.) return;
    DrawBufferObject rect;
    rect.type = fill ? DrawBufferObject::FILLED_RECT : DrawBufferObject::RECT;
    rect.points = {{(double)x, (double)y}, {(double)(x+w), (double)(y+h)}};
    rect.thickness = thickness,
    rect.rel_func = rel_func;
    auto xdiff = render_view.xmax - render_view.xmin;
    auto ydiff = render_view.ymax - render_view.ymin;
    for (size_t i = 0; i < rect.points.size(); ++i) {
        rect.points[i][0] = rect.points[i][0]*1. /
            render_view.swid * xdiff + render_view.xmin;
        rect.points[i][1] = (render_view.shigh - rect.points[i][1])*1. /
            render_view.shigh * ydiff + render_view.ymin;
    }
    if (fill && draw_buf.size()) {
        auto& last_rect = draw_buf.back();
        if (last_rect.type == DrawBufferObject::FILLED_RECT &&
                std::fabs(last_rect.points[0][1] - rect.points[0][1]) < 1e-6 * ydiff &&
                std::fabs(last_rect.points[1][1] - rect.points[1][1]) < 1e-6 * ydiff &&
                std::fabs(last_rect.points[1][0] - rect.points[0][0]) < 1e-6 * xdiff &&
                last_rect.c == c) {
            // Reduce shape count by merging with rectangle to left
            last_rect.points[1][0] = rect.points[1][0];
            return;
        } else if (last_rect.type == DrawBufferObject::FILLED_RECT &&
                std::fabs(last_rect.points[0][0] - rect.points[0][0]) < 1e-6 * xdiff &&
                std::fabs(last_rect.points[1][0] - rect.points[1][0]) < 1e-6 * xdiff &&
                std::fabs(last_rect.points[1][1] - rect.points[0][1]) < 1e-6 * ydiff &&
                last_rect.c == c) {
            // Reduce shape count by merging with rectangle above
            last_rect.points[1][1] = rect.points[1][1];
            return;
        }
    }
    rect.c = c;
    draw_buf.push_back(std::move(rect));
}